

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

stbi_uc * stbi__bmp_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi__uint32 sVar1;
  stbi__uint32 sVar2;
  stbi_uc sVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  uint uVar8;
  uint uVar9;
  uint local_500;
  uint local_4fc;
  uint local_4f8;
  uint local_4f4;
  stbi_uc *p2;
  stbi_uc *p1;
  stbi_uc t;
  int a_1;
  stbi__uint32 v_1;
  int bpp;
  int iStack_4c4;
  uchar a;
  int easy;
  int z_1;
  int acount;
  int bcount;
  int gcount;
  int rcount;
  int ashift;
  int bshift;
  int gshift;
  int rshift;
  int v2;
  int v;
  int z;
  stbi__bmp_data info;
  int target;
  int pad;
  int flip_vertically;
  int width;
  int j;
  int i;
  int psize;
  stbi_uc pal [256] [4];
  uint all_a;
  uint ma;
  uint mb;
  uint mg;
  uint mr;
  stbi_uc *out;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  j = 0;
  info.mb = 0xff;
  pvVar7 = stbi__bmp_parse_header(s,(stbi__bmp_data *)&v);
  if (pvVar7 == (void *)0x0) {
    s_local = (stbi__context *)0x0;
  }
  else {
    sVar1 = s->img_y;
    sVar2 = s->img_y;
    if ((int)sVar2 < 1) {
      sVar2 = -sVar2;
    }
    s->img_y = sVar2;
    pal[0xff][0] = (undefined1)info.mb;
    pal[0xff][1] = info.mb._1_1_;
    pal[0xff][2] = info.mb._2_1_;
    pal[0xff][3] = info.mb._3_1_;
    if (info.bpp == 0xc) {
      if (v < 0x18) {
        j = (z + -0x26) / 3;
      }
    }
    else if (v < 0x10) {
      j = (z + -0xe) - info.bpp >> 2;
    }
    iVar5 = 3;
    if (info.mg != 0) {
      iVar5 = 4;
    }
    s->img_n = iVar5;
    if ((req_comp == 0) || (info.ma = req_comp, req_comp < 3)) {
      info.ma = s->img_n;
    }
    _mg = (stbi__context *)stbi__malloc((ulong)(info.ma * s->img_x * s->img_y));
    if (_mg == (stbi__context *)0x0) {
      stbi__err("outofmem");
      s_local = (stbi__context *)0x0;
    }
    else {
      if (v < 0x10) {
        v2 = 0;
        if ((j == 0) || (0x100 < j)) {
          free(_mg);
          stbi__err("invalid");
          return (stbi_uc *)0x0;
        }
        for (width = 0; width < j; width = width + 1) {
          sVar3 = stbi__get8(s);
          *(stbi_uc *)((long)&i + (long)width * 4 + 2) = sVar3;
          sVar3 = stbi__get8(s);
          *(stbi_uc *)((long)&i + (long)width * 4 + 1) = sVar3;
          sVar3 = stbi__get8(s);
          *(stbi_uc *)(&i + width) = sVar3;
          if (info.bpp != 0xc) {
            stbi__get8(s);
          }
          *(undefined1 *)((long)&i + (long)width * 4 + 3) = 0xff;
        }
        iVar5 = 4;
        if (info.bpp == 0xc) {
          iVar5 = 3;
        }
        stbi__skip(s,((z + -0xe) - info.bpp) - j * iVar5);
        if (v == 4) {
          pad = s->img_x + 1 >> 1;
        }
        else {
          if (v != 8) {
            free(_mg);
            stbi__err("bad bpp");
            return (stbi_uc *)0x0;
          }
          pad = s->img_x;
        }
        info.all_a = -pad & 3;
        for (flip_vertically = 0; flip_vertically < (int)s->img_y;
            flip_vertically = flip_vertically + 1) {
          for (width = 0; width < (int)s->img_x; width = width + 2) {
            bVar4 = stbi__get8(s);
            rshift = (int)bVar4;
            gshift = 0;
            if (v == 4) {
              gshift = rshift & 0xf;
              rshift = rshift >> 4;
            }
            _mg->buffer_start[(long)v2 + -0x38] = (stbi_uc)(&i)[rshift];
            _mg->buffer_start[(long)(v2 + 1) + -0x38] =
                 *(stbi_uc *)((long)&i + (long)rshift * 4 + 1);
            _mg->buffer_start[(long)(v2 + 2) + -0x38] =
                 *(stbi_uc *)((long)&i + (long)rshift * 4 + 2);
            iVar5 = v2 + 3;
            if (info.ma == 4) {
              _mg->buffer_start[(long)(v2 + 3) + -0x38] = 0xff;
              iVar5 = v2 + 4;
            }
            v2 = iVar5;
            if (width + 1U == s->img_x) break;
            if (v == 8) {
              bVar4 = stbi__get8(s);
              local_4f4 = (uint)bVar4;
            }
            else {
              local_4f4 = gshift;
            }
            _mg->buffer_start[(long)v2 + -0x38] = (stbi_uc)(&i)[(int)local_4f4];
            _mg->buffer_start[(long)(v2 + 1) + -0x38] =
                 *(stbi_uc *)((long)&i + (long)(int)local_4f4 * 4 + 1);
            _mg->buffer_start[(long)(v2 + 2) + -0x38] =
                 *(stbi_uc *)((long)&i + (long)(int)local_4f4 * 4 + 2);
            iVar5 = v2 + 3;
            if (info.ma == 4) {
              _mg->buffer_start[(long)(v2 + 3) + -0x38] = 0xff;
              iVar5 = v2 + 4;
            }
            v2 = iVar5;
          }
          stbi__skip(s,info.all_a);
        }
      }
      else {
        bshift = 0;
        ashift = 0;
        rcount = 0;
        gcount = 0;
        bcount = 0;
        acount = 0;
        z_1 = 0;
        easy = 0;
        iStack_4c4 = 0;
        bpp = 0;
        stbi__skip(s,(z + -0xe) - info.bpp);
        if (v == 0x18) {
          pad = s->img_x * 3;
        }
        else if (v == 0x10) {
          pad = s->img_x << 1;
        }
        else {
          pad = 0;
        }
        info.all_a = -pad & 3;
        if (v == 0x18) {
          bpp = 1;
        }
        else if ((((v == 0x20) && (info.mr == 0xff)) && (info.hsz == 0xff00)) &&
                ((info.offset == 0xff0000 && (info.mg == 0xff000000)))) {
          bpp = 2;
        }
        if (bpp == 0) {
          if (((info.offset == 0) || (info.hsz == 0)) || (info.mr == 0)) {
            free(_mg);
            stbi__err("bad masks");
            return (stbi_uc *)0x0;
          }
          iVar5 = stbi__high_bit(info.offset);
          bshift = iVar5 + -7;
          bcount = stbi__bitcount(info.offset);
          iVar5 = stbi__high_bit(info.hsz);
          ashift = iVar5 + -7;
          acount = stbi__bitcount(info.hsz);
          iVar5 = stbi__high_bit(info.mr);
          rcount = iVar5 + -7;
          z_1 = stbi__bitcount(info.mr);
          iVar5 = stbi__high_bit(info.mg);
          gcount = iVar5 + -7;
          easy = stbi__bitcount(info.mg);
        }
        for (flip_vertically = 0; iVar5 = v, flip_vertically < (int)s->img_y;
            flip_vertically = flip_vertically + 1) {
          if (bpp == 0) {
            for (width = 0; width < (int)s->img_x; width = width + 1) {
              if (iVar5 == 0x10) {
                local_4fc = stbi__get16le(s);
              }
              else {
                local_4fc = stbi__get32le(s);
              }
              iVar6 = stbi__shiftsigned(local_4fc & info.offset,bshift,bcount);
              _mg->buffer_start[(long)iStack_4c4 + -0x38] = (stbi_uc)iVar6;
              iVar6 = stbi__shiftsigned(local_4fc & info.hsz,ashift,acount);
              _mg->buffer_start[(long)(iStack_4c4 + 1) + -0x38] = (stbi_uc)iVar6;
              iVar6 = stbi__shiftsigned(local_4fc & info.mr,rcount,z_1);
              _mg->buffer_start[(long)(iStack_4c4 + 2) + -0x38] = (stbi_uc)iVar6;
              if (info.mg == 0) {
                local_500 = 0xff;
              }
              else {
                local_500 = stbi__shiftsigned(local_4fc & info.mg,gcount,easy);
              }
              pal[0xff] = (stbi_uc  [4])(local_500 | (uint)pal[0xff]);
              iVar6 = iStack_4c4 + 3;
              if (info.ma == 4) {
                _mg->buffer_start[(long)(iStack_4c4 + 3) + -0x38] = (stbi_uc)local_500;
                iVar6 = iStack_4c4 + 4;
              }
              iStack_4c4 = iVar6;
            }
          }
          else {
            for (width = 0; width < (int)s->img_x; width = width + 1) {
              sVar3 = stbi__get8(s);
              _mg->buffer_start[(long)(iStack_4c4 + 2) + -0x38] = sVar3;
              sVar3 = stbi__get8(s);
              _mg->buffer_start[(long)(iStack_4c4 + 1) + -0x38] = sVar3;
              sVar3 = stbi__get8(s);
              _mg->buffer_start[(long)iStack_4c4 + -0x38] = sVar3;
              if (bpp == 2) {
                bVar4 = stbi__get8(s);
                local_4f8 = (uint)bVar4;
              }
              else {
                local_4f8 = 0xff;
              }
              pal[0xff] = (stbi_uc  [4])(local_4f8 | (uint)pal[0xff]);
              iVar5 = iStack_4c4 + 3;
              if (info.ma == 4) {
                _mg->buffer_start[(long)(iStack_4c4 + 3) + -0x38] = (stbi_uc)local_4f8;
                iVar5 = iStack_4c4 + 4;
              }
              iStack_4c4 = iVar5;
            }
          }
          stbi__skip(s,info.all_a);
        }
      }
      if ((info.ma == 4) && (pal[0xff] == (stbi_uc  [4])0x0)) {
        for (width = s->img_x * 4 * s->img_y + -1; -1 < width; width = width + -4) {
          _mg->buffer_start[(long)width + -0x38] = 0xff;
        }
      }
      if (0 < (int)sVar1) {
        for (flip_vertically = 0; flip_vertically < (int)s->img_y >> 1;
            flip_vertically = flip_vertically + 1) {
          uVar8 = flip_vertically * s->img_x * info.ma;
          uVar9 = ((s->img_y - 1) - flip_vertically) * s->img_x * info.ma;
          for (width = 0; width < (int)(s->img_x * info.ma); width = width + 1) {
            sVar3 = _mg->buffer_start[(long)width + (ulong)uVar8 + -0x38];
            _mg->buffer_start[(long)width + (ulong)uVar8 + -0x38] =
                 _mg->buffer_start[(long)width + (ulong)uVar9 + -0x38];
            _mg->buffer_start[(long)width + (ulong)uVar9 + -0x38] = sVar3;
          }
        }
      }
      if (((req_comp == 0) || (req_comp == info.ma)) ||
         (_mg = (stbi__context *)
                stbi__convert_format((uchar *)_mg,info.ma,req_comp,s->img_x,s->img_y), s_local = _mg
         , _mg != (stbi__context *)0x0)) {
        *x = s->img_x;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
        }
        s_local = _mg;
      }
    }
  }
  return (stbi_uc *)s_local;
}

Assistant:

static stbi_uc *stbi__bmp_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi_uc *out;
   unsigned int mr=0,mg=0,mb=0,ma=0, all_a;
   stbi_uc pal[256][4];
   int psize=0,i,j,width;
   int flip_vertically, pad, target;
   stbi__bmp_data info;

   info.all_a = 255;   
   if (stbi__bmp_parse_header(s, &info) == NULL)
      return NULL; // error code already set

   flip_vertically = ((int) s->img_y) > 0;
   s->img_y = abs((int) s->img_y);

   mr = info.mr;
   mg = info.mg;
   mb = info.mb;
   ma = info.ma;
   all_a = info.all_a;

   if (info.hsz == 12) {
      if (info.bpp < 24)
         psize = (info.offset - 14 - 24) / 3;
   } else {
      if (info.bpp < 16)
         psize = (info.offset - 14 - info.hsz) >> 2;
   }

   s->img_n = ma ? 4 : 3;
   if (req_comp && req_comp >= 3) // we can directly decode 3 or 4
      target = req_comp;
   else
      target = s->img_n; // if they want monochrome, we'll post-convert

   out = (stbi_uc *) stbi__malloc(target * s->img_x * s->img_y);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   if (info.bpp < 16) {
      int z=0;
      if (psize == 0 || psize > 256) { STBI_FREE(out); return stbi__errpuc("invalid", "Corrupt BMP"); }
      for (i=0; i < psize; ++i) {
         pal[i][2] = stbi__get8(s);
         pal[i][1] = stbi__get8(s);
         pal[i][0] = stbi__get8(s);
         if (info.hsz != 12) stbi__get8(s);
         pal[i][3] = 255;
      }
      stbi__skip(s, info.offset - 14 - info.hsz - psize * (info.hsz == 12 ? 3 : 4));
      if (info.bpp == 4) width = (s->img_x + 1) >> 1;
      else if (info.bpp == 8) width = s->img_x;
      else { STBI_FREE(out); return stbi__errpuc("bad bpp", "Corrupt BMP"); }
      pad = (-width)&3;
      for (j=0; j < (int) s->img_y; ++j) {
         for (i=0; i < (int) s->img_x; i += 2) {
            int v=stbi__get8(s),v2=0;
            if (info.bpp == 4) {
               v2 = v & 15;
               v >>= 4;
            }
            out[z++] = pal[v][0];
            out[z++] = pal[v][1];
            out[z++] = pal[v][2];
            if (target == 4) out[z++] = 255;
            if (i+1 == (int) s->img_x) break;
            v = (info.bpp == 8) ? stbi__get8(s) : v2;
            out[z++] = pal[v][0];
            out[z++] = pal[v][1];
            out[z++] = pal[v][2];
            if (target == 4) out[z++] = 255;
         }
         stbi__skip(s, pad);
      }
   } else {
      int rshift=0,gshift=0,bshift=0,ashift=0,rcount=0,gcount=0,bcount=0,acount=0;
      int z = 0;
      int easy=0;
      stbi__skip(s, info.offset - 14 - info.hsz);
      if (info.bpp == 24) width = 3 * s->img_x;
      else if (info.bpp == 16) width = 2*s->img_x;
      else /* bpp = 32 and pad = 0 */ width=0;
      pad = (-width) & 3;
      if (info.bpp == 24) {
         easy = 1;
      } else if (info.bpp == 32) {
         if (mb == 0xff && mg == 0xff00 && mr == 0x00ff0000 && ma == 0xff000000)
            easy = 2;
      }
      if (!easy) {
         if (!mr || !mg || !mb) { STBI_FREE(out); return stbi__errpuc("bad masks", "Corrupt BMP"); }
         // right shift amt to put high bit in position #7
         rshift = stbi__high_bit(mr)-7; rcount = stbi__bitcount(mr);
         gshift = stbi__high_bit(mg)-7; gcount = stbi__bitcount(mg);
         bshift = stbi__high_bit(mb)-7; bcount = stbi__bitcount(mb);
         ashift = stbi__high_bit(ma)-7; acount = stbi__bitcount(ma);
      }
      for (j=0; j < (int) s->img_y; ++j) {
         if (easy) {
            for (i=0; i < (int) s->img_x; ++i) {
               unsigned char a;
               out[z+2] = stbi__get8(s);
               out[z+1] = stbi__get8(s);
               out[z+0] = stbi__get8(s);
               z += 3;
               a = (easy == 2 ? stbi__get8(s) : 255);
               all_a |= a;
               if (target == 4) out[z++] = a;
            }
         } else {
            int bpp = info.bpp;
            for (i=0; i < (int) s->img_x; ++i) {
               stbi__uint32 v = (bpp == 16 ? (stbi__uint32) stbi__get16le(s) : stbi__get32le(s));
               int a;
               out[z++] = STBI__BYTECAST(stbi__shiftsigned(v & mr, rshift, rcount));
               out[z++] = STBI__BYTECAST(stbi__shiftsigned(v & mg, gshift, gcount));
               out[z++] = STBI__BYTECAST(stbi__shiftsigned(v & mb, bshift, bcount));
               a = (ma ? stbi__shiftsigned(v & ma, ashift, acount) : 255);
               all_a |= a;
               if (target == 4) out[z++] = STBI__BYTECAST(a);
            }
         }
         stbi__skip(s, pad);
      }
   }
   
   // if alpha channel is all 0s, replace with all 255s
   if (target == 4 && all_a == 0)
      for (i=4*s->img_x*s->img_y-1; i >= 0; i -= 4)
         out[i] = 255;

   if (flip_vertically) {
      stbi_uc t;
      for (j=0; j < (int) s->img_y>>1; ++j) {
         stbi_uc *p1 = out +      j     *s->img_x*target;
         stbi_uc *p2 = out + (s->img_y-1-j)*s->img_x*target;
         for (i=0; i < (int) s->img_x*target; ++i) {
            t = p1[i], p1[i] = p2[i], p2[i] = t;
         }
      }
   }

   if (req_comp && req_comp != target) {
      out = stbi__convert_format(out, target, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;
   return out;
}